

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O3

void __thiscall
xLearn::MAPEMetricTest_mape_test_Test::~MAPEMetricTest_mape_test_Test
          (MAPEMetricTest_mape_test_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MAPEMetricTest, mape_test) {
  std::vector<real_t> Y;
  Y.push_back(12);
  Y.push_back(12);
  Y.push_back(12);
  Y.push_back(12);
  std::vector<real_t> pred;
  pred.push_back(11);
  pred.push_back(11);
  pred.push_back(11);
  pred.push_back(11);
  MAPEMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, 0.0833333333);
  metric.Reset();
  Y[0] = 23;
  Y[1] = 23;
  Y[2] = 23;
  Y[3] = 23;
  pred[0] = 12;
  pred[1] = 12;
  pred[2] = 12;
  pred[3] = 12;
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, 0.478260869);
  EXPECT_EQ(metric.metric_type(), "MAPE");
}